

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Crop_x86::forward
          (Crop_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *pMVar1;
  undefined8 *puVar2;
  int iVar3;
  Mat *pMVar4;
  Mat *this_00;
  int *piVar5;
  void *pvVar6;
  long *plVar7;
  Allocator *pAVar8;
  ulong uVar9;
  size_t sVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  bool bVar13;
  int iVar14;
  int iVar15;
  Allocator *pAVar16;
  pointer pMVar17;
  ulong uVar18;
  long lVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  pointer unaff_R12;
  ulong uVar23;
  long lVar24;
  bool bVar25;
  bool bVar26;
  int local_190;
  Mat m;
  int _outw;
  int _outh;
  int _woffset;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blob_shapes;
  int iStack_110;
  Allocator *local_108;
  int iStack_100;
  int iStack_fc;
  int local_f8;
  int iStack_f4;
  int iStack_f0;
  size_t local_e8;
  int _outc;
  int _outd;
  int _hoffset;
  int local_d4;
  int local_d0;
  int _coffset;
  Option *local_c8;
  int local_c0;
  int _doffset;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_b8;
  int local_b0;
  int local_ac;
  size_t local_a8;
  Crop *local_a0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blobs_unpacked;
  
  local_190 = (int)unaff_R12;
  pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_d4 = pMVar4->w;
  local_c0 = pMVar4->h;
  iVar3 = pMVar4->d;
  local_b0 = pMVar4->c;
  local_d0 = pMVar4->dims;
  local_a8 = pMVar4->elemsize;
  local_ac = pMVar4->elempack;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_c8 = opt;
  local_b8 = bottom_blobs;
  local_a0 = &this->super_Crop;
  if (((this->super_Crop).starts_expr._M_string_length != 0) &&
     ((this->super_Crop).ends_expr._M_string_length != 0)) {
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              (&bottom_blob_shapes,
               ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)pMVar4 >> 3) *
               -0x71c71c71c71c71c7,(allocator_type *)&m);
    pMVar17 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_finish != pMVar17) {
      lVar24 = 0;
      uVar23 = 0;
      do {
        unaff_R12 = bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        switch(*(undefined4 *)((long)&pMVar17->dims + lVar24)) {
        case 1:
          m.cstep = (long)*(int *)((long)&pMVar17->elempack + lVar24) *
                    (long)*(int *)((long)&pMVar17->w + lVar24);
          m.dims = 1;
          m.w = (int)m.cstep;
          m.h = 1;
          break;
        case 2:
          m.w = *(int *)((long)&pMVar17->w + lVar24);
          lVar19 = (long)*(int *)((long)&pMVar17->elempack + lVar24) *
                   (long)*(int *)((long)&pMVar17->h + lVar24);
          m.dims = 2;
          m.h = (int)lVar19;
          m.cstep = lVar19 * m.w;
          break;
        case 3:
          m.w = *(int *)((long)&pMVar17->w + lVar24);
          m.h = *(int *)((long)&pMVar17->h + lVar24);
          m.c = *(int *)((long)&pMVar17->elempack + lVar24) * *(int *)((long)&pMVar17->c + lVar24);
          m.dims = 3;
          m.d = 1;
          lVar19 = (long)m.h * (long)m.w;
          goto LAB_002830b9;
        case 4:
          m.w = *(int *)((long)&pMVar17->w + lVar24);
          m.h = *(int *)((long)&pMVar17->h + lVar24);
          m.d = *(int *)((long)&pMVar17->d + lVar24);
          m.c = *(int *)((long)&pMVar17->elempack + lVar24) * *(int *)((long)&pMVar17->c + lVar24);
          m.dims = 4;
          lVar19 = (long)m.h * (long)m.w * (long)m.d;
LAB_002830b9:
          m.elempack = 1;
          m.elemsize._0_4_ = 4;
          m.cstep = lVar19 + 3U & 0x3ffffffffffffffc;
          goto LAB_00283147;
        default:
          m.cstep = 0;
          m.elemsize._0_4_ = 0;
          m.elempack = 0;
          m.h = 0;
          m.d = 0;
          m.c = 0;
          m.dims = 0;
          m.w = 0;
          goto LAB_00283147;
        }
        m.c = 1;
        m.d = 1;
        m.elempack = 1;
        m.elemsize._0_4_ = 4;
LAB_00283147:
        m.elemsize._4_4_ = 0;
        m.refcount._4_4_ = 0;
        m.refcount._0_4_ = 0;
        m.allocator = (Allocator *)0x0;
        m.data = (void *)0x0;
        pMVar1 = (Mat *)((long)&(bottom_blob_shapes.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_start)->data + lVar24);
        if (pMVar1 != &m) {
          piVar5 = *(int **)((long)&(bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->refcount + lVar24);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              pvVar6 = *(void **)((long)&(bottom_blob_shapes.
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                          _M_impl.super__Vector_impl_data._M_start)->data + lVar24);
              plVar7 = *(long **)((long)&(bottom_blob_shapes.
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                          _M_impl.super__Vector_impl_data._M_start)->allocator +
                                 lVar24);
              if (plVar7 == (long *)0x0) {
                if (pvVar6 != (void *)0x0) {
                  free(pvVar6);
                }
              }
              else {
                (**(code **)(*plVar7 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&unaff_R12->cstep + lVar24) = 0;
          *(undefined8 *)((long)&pMVar1->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar1->elemsize + 4) = 0;
          pMVar1->data = (void *)0x0;
          pMVar1->refcount = (int *)0x0;
          puVar2 = (undefined8 *)((long)&unaff_R12->dims + lVar24);
          *puVar2 = 0;
          puVar2[1] = 0;
          *(undefined4 *)((long)&unaff_R12->c + lVar24) = 0;
          puVar2 = (undefined8 *)((long)&unaff_R12->data + lVar24);
          *puVar2 = m.data;
          puVar2[1] = CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          *(ulong *)((long)&unaff_R12->elemsize + lVar24) =
               CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
          *(int *)((long)&unaff_R12->elempack + lVar24) = m.elempack;
          *(Allocator **)((long)&unaff_R12->allocator + lVar24) = m.allocator;
          piVar5 = (int *)((long)&unaff_R12->dims + lVar24);
          *piVar5 = m.dims;
          piVar5[1] = m.w;
          piVar5[2] = m.h;
          piVar5[3] = m.d;
          *(int *)((long)&unaff_R12->c + lVar24) = m.c;
          *(size_t *)((long)&unaff_R12->cstep + lVar24) = m.cstep;
        }
        bottom_blobs = local_b8;
        piVar5 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (m.allocator == (Allocator *)0x0) {
              if (m.data != (void *)0x0) {
                free(m.data);
              }
            }
            else {
              (*(m.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        m.cstep = 0;
        m.data = (void *)0x0;
        m.refcount._0_4_ = 0;
        m.refcount._4_4_ = 0;
        m.elemsize._0_4_ = 0;
        m.elemsize._4_4_ = 0;
        m.elempack = 0;
        m.dims = 0;
        m.w = 0;
        m.h = 0;
        m.d = 0;
        m.c = 0;
        uVar23 = uVar23 + 1;
        pMVar17 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        lVar24 = lVar24 + 0x48;
      } while (uVar23 < (ulong)(((long)(bottom_blobs->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar17 >>
                                3) * -0x71c71c71c71c71c7));
    }
    local_190 = (int)unaff_R12;
    Crop::eval_crop_expr
              (local_a0,&bottom_blob_shapes,&_woffset,&_hoffset,&_doffset,&_coffset,&_outw,&_outh,
               &_outd,&_outc);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&bottom_blob_shapes);
    goto LAB_00283308;
  }
  if ((this->super_Crop).woffset != -0xe9) {
    switch(pMVar4->dims) {
    case 1:
      m.cstep = (long)pMVar4->elempack * (long)pMVar4->w;
      m.elemsize._0_4_ = 4;
      m.elempack = 1;
      m.dims = 1;
      m.w = (int)m.cstep;
      m.h = 1;
      m.d = 1;
      m.c = 1;
      break;
    case 2:
      m.w = pMVar4->w;
      lVar24 = (long)pMVar4->elempack * (long)pMVar4->h;
      m.elemsize._0_4_ = 4;
      m.elempack = 1;
      m.dims = 2;
      m.h = (int)lVar24;
      m.d = 1;
      m.c = 1;
      m.cstep = lVar24 * m.w;
      break;
    case 3:
      m.w = pMVar4->w;
      m.h = pMVar4->h;
      m.c = pMVar4->elempack * pMVar4->c;
      m.dims = 3;
      m.d = 1;
      lVar24 = (long)m.h * (long)m.w;
      goto LAB_00283649;
    case 4:
      m.w = pMVar4->w;
      m.h = pMVar4->h;
      m.d = pMVar4->d;
      m.c = pMVar4->elempack * pMVar4->c;
      m.dims = 4;
      lVar24 = (long)m.h * (long)m.w * (long)m.d;
LAB_00283649:
      m.elempack = 1;
      m.elemsize._0_4_ = 4;
      m.cstep = lVar24 + 3U & 0x3ffffffffffffffc;
      break;
    default:
      m.cstep = 0;
      m.elemsize._0_4_ = 0;
      m.elempack = 0;
      m.dims = 0;
      m.w = 0;
      m.h = 0;
      m.d = 0;
      m.c = 0;
    }
    m.elemsize._4_4_ = 0;
    m.refcount._4_4_ = 0;
    m.refcount._0_4_ = 0;
    m.allocator = (Allocator *)0x0;
    m.data = (void *)0x0;
    switch(pMVar4[1].dims) {
    case 1:
      local_e8 = (long)pMVar4[1].elempack * (long)pMVar4[1].w;
      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 4;
      iStack_110 = 1;
      iStack_100 = 1;
      iStack_fc = (int)local_e8;
      local_f8 = 1;
      iStack_f4 = 1;
      iStack_f0 = 1;
      break;
    case 2:
      iStack_fc = pMVar4[1].w;
      lVar24 = (long)pMVar4[1].elempack * (long)pMVar4[1].h;
      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 4;
      iStack_110 = 1;
      iStack_100 = 2;
      local_f8 = (int)lVar24;
      iStack_f4 = 1;
      iStack_f0 = 1;
      local_e8 = lVar24 * iStack_fc;
      break;
    case 3:
      iStack_fc = pMVar4[1].w;
      local_f8 = pMVar4[1].h;
      iStack_f0 = pMVar4[1].elempack * pMVar4[1].c;
      iStack_100 = 3;
      iStack_f4 = 1;
      lVar24 = (long)local_f8 * (long)iStack_fc;
      goto LAB_00283973;
    case 4:
      iStack_fc = pMVar4[1].w;
      local_f8 = pMVar4[1].h;
      iStack_f4 = pMVar4[1].d;
      iStack_f0 = pMVar4[1].elempack * pMVar4[1].c;
      iStack_100 = 4;
      lVar24 = (long)local_f8 * (long)iStack_fc * (long)iStack_f4;
LAB_00283973:
      iStack_110 = 1;
      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 4;
      local_e8 = lVar24 + 3U & 0x3ffffffffffffffc;
      break;
    default:
      local_e8 = 0;
      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      iStack_110 = 0;
      iStack_100 = 0;
      iStack_fc = 0;
      local_f8 = 0;
      iStack_f4 = 0;
      iStack_f0 = 0;
    }
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = 0;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0;
    local_108 = (Allocator *)0x0;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    Crop::resolve_crop_roi
              (&this->super_Crop,&m,(Mat *)&bottom_blob_shapes,&_woffset,&_hoffset,&_doffset,
               &_coffset,&_outw,&_outh,&_outd,&_outc);
    piVar5 = (int *)CONCAT44(bottom_blob_shapes.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_finish._4_4_,
                             bottom_blob_shapes.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_finish._0_4_);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if ((*piVar5 == 0) &&
         (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0)) {
        free(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start);
      }
    }
    piVar5 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 != 0) goto LAB_00283308;
      if (m.allocator != (Allocator *)0x0) {
        (*(m.allocator)->_vptr_Allocator[3])();
        goto LAB_00283308;
      }
      if (m.data == (void *)0x0) goto LAB_00283308;
      goto LAB_00283b70;
    }
    goto LAB_00283308;
  }
  switch(pMVar4->dims) {
  case 1:
    m.cstep = (long)pMVar4->elempack * (long)pMVar4->w;
    m.elemsize._0_4_ = 4;
    m.elempack = 1;
    m.dims = 1;
    m.w = (int)m.cstep;
    m.h = 1;
    m.d = 1;
    m.c = 1;
    break;
  case 2:
    m.w = pMVar4->w;
    lVar24 = (long)pMVar4->elempack * (long)pMVar4->h;
    m.elemsize._0_4_ = 4;
    m.elempack = 1;
    m.dims = 2;
    m.h = (int)lVar24;
    m.d = 1;
    m.c = 1;
    m.cstep = lVar24 * m.w;
    break;
  case 3:
    m.w = pMVar4->w;
    m.h = pMVar4->h;
    m.c = pMVar4->elempack * pMVar4->c;
    m.dims = 3;
    m.d = 1;
    lVar24 = (long)m.h * (long)m.w;
    goto LAB_002835d4;
  case 4:
    m.w = pMVar4->w;
    m.h = pMVar4->h;
    m.d = pMVar4->d;
    m.c = pMVar4->elempack * pMVar4->c;
    m.dims = 4;
    lVar24 = (long)m.h * (long)m.w * (long)m.d;
LAB_002835d4:
    m.elempack = 1;
    m.elemsize._0_4_ = 4;
    m.cstep = lVar24 + 3U & 0x3ffffffffffffffc;
    break;
  default:
    m.cstep = 0;
    m.elemsize._0_4_ = 0;
    m.elempack = 0;
    m.dims = 0;
    m.w = 0;
    m.h = 0;
    m.d = 0;
    m.c = 0;
  }
  m.elemsize._4_4_ = 0;
  m.refcount._4_4_ = 0;
  m.refcount._0_4_ = 0;
  m.allocator = (Allocator *)0x0;
  m.data = (void *)0x0;
  Crop::resolve_crop_roi
            (&this->super_Crop,&m,(int *)pMVar4[1].data,&_woffset,&_hoffset,&_doffset,&_coffset,
             &_outw,&_outh,&_outd,&_outc);
  piVar5 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (m.allocator == (Allocator *)0x0) {
        if (m.data != (void *)0x0) {
LAB_00283b70:
          free(m.data);
        }
      }
      else {
        (*(m.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_00283308:
  iVar21 = local_d0;
  if (local_ac != 4) goto LAB_00284a0a;
  if (local_d0 == 1) {
    uVar20 = _outw & 3;
    iVar22 = (uint)(uVar20 == 0) * 3 + 1;
    if (_outw / iVar22 == local_d4 && uVar20 == 0) {
      if (this_00 != pMVar4) {
        piVar5 = pMVar4->refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + 1;
          UNLOCK();
        }
        piVar5 = this_00->refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            pvVar6 = this_00->data;
            pAVar8 = this_00->allocator;
            if (pAVar8 == (Allocator *)0x0) {
              if (pvVar6 != (void *)0x0) {
                free(pvVar6);
              }
            }
            else {
              (*pAVar8->_vptr_Allocator[3])(pAVar8,pvVar6,(long)_outw % (long)iVar22 & 0xffffffff);
            }
          }
        }
        this_00->cstep = 0;
        this_00->data = (void *)0x0;
        this_00->refcount = (int *)0x0;
        *(undefined8 *)((long)&this_00->refcount + 4) = 0;
        *(undefined8 *)((long)&this_00->elemsize + 4) = 0;
        this_00->dims = 0;
        this_00->w = 0;
        this_00->h = 0;
        this_00->d = 0;
        this_00->c = 0;
        piVar5 = pMVar4->refcount;
        this_00->data = pMVar4->data;
        this_00->refcount = piVar5;
        this_00->elemsize = pMVar4->elemsize;
        this_00->elempack = pMVar4->elempack;
        this_00->allocator = pMVar4->allocator;
        iVar22 = pMVar4->w;
        iVar14 = pMVar4->h;
        iVar15 = pMVar4->d;
        this_00->dims = pMVar4->dims;
        this_00->w = iVar22;
        this_00->h = iVar14;
        this_00->d = iVar15;
        this_00->c = pMVar4->c;
        this_00->cstep = pMVar4->cstep;
      }
LAB_00283bed:
      bVar25 = false;
      local_190 = 0;
    }
    else if (((_outw | _woffset) & 3U) == 0) {
      Mat::create(this_00,_outw / iVar22,(local_a8 >> 2) << (uVar20 == 0) * '\x02',iVar22,
                  local_c8->blob_allocator);
      local_190 = -100;
      if (this_00->data == (void *)0x0) {
        bVar25 = false;
      }
      else {
        bVar25 = false;
        if ((long)this_00->c * this_00->cstep != 0) {
          iVar22 = _woffset + 3;
          if (-1 < _woffset) {
            iVar22 = _woffset;
          }
          crop_pack4_sse(pMVar4,this_00,0,iVar22 >> 2);
          goto LAB_00283bed;
        }
      }
    }
    else {
      bVar25 = true;
    }
    if (!bVar25) {
      return local_190;
    }
  }
  if (iVar21 == 2) {
    bVar25 = (_outh & 3U) == 0;
    iVar22 = (uint)bVar25 * 3 + 1;
    if (_outw == local_d4) {
      if (((_outh & 3U) != 0) || (_outh / iVar22 != local_c0)) goto LAB_00283c90;
      if (this_00 != pMVar4) {
        piVar5 = pMVar4->refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + 1;
          UNLOCK();
        }
        piVar5 = this_00->refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            pvVar6 = this_00->data;
            pAVar8 = this_00->allocator;
            if (pAVar8 == (Allocator *)0x0) {
              if (pvVar6 != (void *)0x0) {
                free(pvVar6);
              }
            }
            else {
              (*pAVar8->_vptr_Allocator[3])(pAVar8,pvVar6,(long)_outh % (long)iVar22 & 0xffffffff);
            }
          }
        }
        this_00->cstep = 0;
        this_00->data = (void *)0x0;
        this_00->refcount = (int *)0x0;
        *(undefined8 *)((long)&this_00->refcount + 4) = 0;
        *(undefined8 *)((long)&this_00->elemsize + 4) = 0;
        this_00->dims = 0;
        this_00->w = 0;
        this_00->h = 0;
        this_00->d = 0;
        this_00->c = 0;
        piVar5 = pMVar4->refcount;
        this_00->data = pMVar4->data;
        this_00->refcount = piVar5;
        this_00->elemsize = pMVar4->elemsize;
        this_00->elempack = pMVar4->elempack;
        this_00->allocator = pMVar4->allocator;
        iVar22 = pMVar4->w;
        iVar14 = pMVar4->h;
        iVar15 = pMVar4->d;
        this_00->dims = pMVar4->dims;
        this_00->w = iVar22;
        this_00->h = iVar14;
        this_00->d = iVar15;
        this_00->c = pMVar4->c;
        this_00->cstep = pMVar4->cstep;
      }
LAB_00283d76:
      bVar26 = false;
      local_190 = 0;
    }
    else {
LAB_00283c90:
      bVar26 = true;
      if (((_hoffset | _outh) & 3U) == 0) {
        Mat::create(this_00,_outw,_outh / iVar22,(local_a8 >> 2) << bVar25 * '\x02',iVar22,
                    local_c8->blob_allocator);
        local_190 = -100;
        if (this_00->data == (void *)0x0) {
          bVar26 = false;
        }
        else {
          bVar26 = false;
          if ((long)this_00->c * this_00->cstep != 0) {
            iVar22 = _hoffset + 3;
            if (-1 < _hoffset) {
              iVar22 = _hoffset;
            }
            crop_pack4_sse(pMVar4,this_00,iVar22 >> 2,_woffset);
            goto LAB_00283d76;
          }
        }
      }
    }
    if (!bVar26) {
      return local_190;
    }
  }
  if (iVar21 == 3) {
    bVar25 = (_outc & 3U) == 0;
    iVar21 = (uint)bVar25 * 3 + 1;
    uVar23 = local_a8 >> 2;
    bVar26 = _outh != local_c0 || _outw != local_d4;
    if (bVar26) {
LAB_00283e32:
      bVar13 = true;
      if (((_coffset | _outc) & 3U) == 0) {
        m.c = _outc / iVar21;
        m.w = pMVar4->w;
        m.h = pMVar4->h;
        uVar9 = pMVar4->elemsize;
        m.data = (void *)((long)(_coffset / iVar21) * pMVar4->cstep * uVar9 + (long)pMVar4->data);
        m.d = pMVar4->d;
        m.elempack = pMVar4->elempack;
        m.allocator = pMVar4->allocator;
        m.refcount._0_4_ = 0;
        m.refcount._4_4_ = 0;
        m.elemsize._0_4_ = (undefined4)uVar9;
        m.elemsize._4_4_ = (undefined4)(uVar9 >> 0x20);
        uVar18 = (long)m.d * uVar9 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0;
        m.cstep = uVar18 / uVar9;
        m.dims = pMVar4->dims;
        if (bVar26) {
LAB_0028409f:
          Mat::create(this_00,_outw,_outh,_outc / iVar21,uVar23 << bVar25 * '\x02',iVar21,
                      local_c8->blob_allocator);
          local_190 = -100;
          if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
            if (this_00->c < 1) {
              local_190 = 0;
            }
            else {
              lVar24 = 0;
              do {
                pAVar8 = m.allocator;
                bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_start =
                     (pointer)(m.cstep * lVar24 * CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize)
                              + (long)m.data);
                bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_finish._0_4_ = 0;
                bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_finish._4_4_ = 0;
                bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)m.elemsize;
                bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage._4_4_ = m.elemsize._4_4_;
                local_108 = m.allocator;
                sVar10 = this_00->elemsize;
                bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_start =
                     (pointer)(this_00->cstep * lVar24 * sVar10 + (long)this_00->data);
                bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)sVar10;
                bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                     (undefined4)(sVar10 >> 0x20);
                crop_pack4_sse((Mat *)&bottom_blob_shapes,(Mat *)&bottom_blobs_unpacked,_hoffset,
                               _woffset);
                bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                piVar5 = (int *)CONCAT44(bottom_blob_shapes.
                                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                         _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                         bottom_blob_shapes.
                                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                         _M_impl.super__Vector_impl_data._M_finish._0_4_);
                if (piVar5 != (int *)0x0) {
                  LOCK();
                  *piVar5 = *piVar5 + -1;
                  UNLOCK();
                  if (*piVar5 == 0) {
                    if (pAVar8 == (Allocator *)0x0) {
                      if (bottom_blob_shapes.
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                          super__Vector_impl_data._M_start != (pointer)0x0) {
                        free(bottom_blob_shapes.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_start);
                      }
                    }
                    else {
                      (*pAVar8->_vptr_Allocator[3])();
                    }
                  }
                }
                local_e8 = 0;
                bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_start = (pointer)0x0;
                bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_finish._0_4_ = 0;
                bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_finish._4_4_ = 0;
                bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                iStack_110 = 0;
                iStack_100 = 0;
                iStack_fc = 0;
                local_f8 = 0;
                iStack_f4 = 0;
                iStack_f0 = 0;
                lVar24 = lVar24 + 1;
              } while (lVar24 < this_00->c);
              local_190 = 0;
              bottom_blobs = local_b8;
            }
          }
        }
        else {
          Mat::clone((Mat *)&bottom_blob_shapes,(__fn *)&m,local_c8->blob_allocator,(int)uVar18,
                     (void *)(long)m.w);
          bottom_blobs = local_b8;
          if (this_00 != (Mat *)&bottom_blob_shapes) {
            piVar5 = (int *)CONCAT44(bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                     bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._0_4_);
            if (piVar5 != (int *)0x0) {
              LOCK();
              *piVar5 = *piVar5 + 1;
              UNLOCK();
            }
            piVar5 = this_00->refcount;
            if (piVar5 != (int *)0x0) {
              LOCK();
              *piVar5 = *piVar5 + -1;
              UNLOCK();
              if (*piVar5 == 0) {
                if (this_00->allocator == (Allocator *)0x0) {
                  if (this_00->data != (void *)0x0) {
                    free(this_00->data);
                  }
                }
                else {
                  (*this_00->allocator->_vptr_Allocator[3])();
                }
              }
            }
            this_00->cstep = 0;
            this_00->data = (void *)0x0;
            this_00->refcount = (int *)0x0;
            *(undefined8 *)((long)&this_00->refcount + 4) = 0;
            *(undefined8 *)((long)&this_00->elemsize + 4) = 0;
            this_00->dims = 0;
            this_00->w = 0;
            this_00->h = 0;
            this_00->d = 0;
            this_00->c = 0;
            this_00->data =
                 bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            this_00->refcount =
                 (int *)CONCAT44(bottom_blob_shapes.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_finish._4_4_,
                                 bottom_blob_shapes.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_finish._0_4_);
            this_00->elemsize =
                 CONCAT44(bottom_blob_shapes.
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage._4_4_,
                          bottom_blob_shapes.
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage._0_4_);
            this_00->elempack = iStack_110;
            this_00->allocator = local_108;
            this_00->dims = iStack_100;
            this_00->w = iStack_fc;
            this_00->h = local_f8;
            this_00->d = iStack_f4;
            this_00->c = iStack_f0;
            this_00->cstep = local_e8;
          }
          piVar5 = (int *)CONCAT44(bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_finish._4_4_,
                                   bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_finish._0_4_);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              if (local_108 == (Allocator *)0x0) {
                if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  free(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                       _M_impl.super__Vector_impl_data._M_start);
                }
              }
              else {
                (*local_108->_vptr_Allocator[3])();
              }
            }
          }
          local_190 = -100;
          if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0))
          goto LAB_0028409f;
        }
        piVar5 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (m.allocator == (Allocator *)0x0) {
              if (m.data != (void *)0x0) {
                free(m.data);
              }
            }
            else {
              (*(m.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        m.cstep = 0;
        m.data = (void *)0x0;
        m.refcount._0_4_ = 0;
        m.refcount._4_4_ = 0;
        m.elemsize._0_4_ = 0;
        m.elemsize._4_4_ = 0;
        m.elempack = 0;
        m.dims = 0;
        m.w = 0;
        m.h = 0;
        m.d = 0;
        m.c = 0;
        bVar13 = false;
      }
    }
    else {
      if (((_outc & 3U) != 0) || (_outc / iVar21 != local_b0)) goto LAB_00283e32;
      if (this_00 != pMVar4) {
        piVar5 = pMVar4->refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + 1;
          UNLOCK();
        }
        piVar5 = this_00->refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            pvVar6 = this_00->data;
            pAVar8 = this_00->allocator;
            if (pAVar8 == (Allocator *)0x0) {
              if (pvVar6 != (void *)0x0) {
                free(pvVar6);
              }
            }
            else {
              (*pAVar8->_vptr_Allocator[3])(pAVar8,pvVar6,(long)_outc % (long)iVar21 & 0xffffffff);
            }
          }
        }
        this_00->cstep = 0;
        this_00->data = (void *)0x0;
        this_00->refcount = (int *)0x0;
        *(undefined8 *)((long)&this_00->refcount + 4) = 0;
        *(undefined8 *)((long)&this_00->elemsize + 4) = 0;
        this_00->dims = 0;
        this_00->w = 0;
        this_00->h = 0;
        this_00->d = 0;
        this_00->c = 0;
        piVar5 = pMVar4->refcount;
        this_00->data = pMVar4->data;
        this_00->refcount = piVar5;
        this_00->elemsize = pMVar4->elemsize;
        this_00->elempack = pMVar4->elempack;
        this_00->allocator = pMVar4->allocator;
        iVar21 = pMVar4->w;
        iVar22 = pMVar4->h;
        iVar14 = pMVar4->d;
        this_00->dims = pMVar4->dims;
        this_00->w = iVar21;
        this_00->h = iVar22;
        this_00->d = iVar14;
        this_00->c = pMVar4->c;
        this_00->cstep = pMVar4->cstep;
      }
      bVar13 = false;
      local_190 = 0;
    }
    iVar21 = local_d0;
    if (!bVar13) {
      return local_190;
    }
  }
  if (iVar21 != 4) goto LAB_00284a0a;
  bVar25 = (_outc & 3U) == 0;
  iVar21 = (uint)bVar25 * 3 + 1;
  uVar23 = local_a8 >> 2;
  bVar26 = iVar3 != _outd || (local_c0 != _outh || local_d4 != _outw);
  if (bVar26) {
LAB_0028447e:
    bVar13 = true;
    if (((_coffset | _outc) & 3U) == 0) {
      m.c = _outc / iVar21;
      m.w = pMVar4->w;
      m.h = pMVar4->h;
      uVar9 = pMVar4->elemsize;
      m.data = (void *)((long)(_coffset / iVar21) * pMVar4->cstep * uVar9 + (long)pMVar4->data);
      m.d = pMVar4->d;
      m.elempack = pMVar4->elempack;
      m.allocator = pMVar4->allocator;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = (undefined4)uVar9;
      m.elemsize._4_4_ = (undefined4)(uVar9 >> 0x20);
      uVar18 = (long)m.d * uVar9 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0;
      m.cstep = uVar18 / uVar9;
      m.dims = pMVar4->dims;
      if (bVar26) {
LAB_002846e4:
        Mat::create(this_00,_outw,_outh,_outd,_outc / iVar21,uVar23 << bVar25 * '\x02',iVar21,
                    local_c8->blob_allocator);
        local_190 = -100;
        if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
          if (this_00->c < 1) {
            local_190 = 0;
          }
          else {
            lVar24 = 0;
            do {
              if (0 < _outd) {
                lVar19 = 0;
                do {
                  pAVar16 = m.allocator;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       (pointer)((long)m.data +
                                (long)(_doffset + (int)lVar19) *
                                CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize) *
                                (long)m.h * (long)m.w +
                                m.cstep * lVar24 * CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize)
                                );
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)m.elemsize;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = m.elemsize._4_4_;
                  sVar10 = this_00->elemsize;
                  pAVar8 = this_00->allocator;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       (pointer)((long)this_00->data +
                                lVar19 * sVar10 * (long)this_00->h * (long)this_00->w +
                                this_00->cstep * lVar24 * sVar10);
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)sVar10;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                       (undefined4)(sVar10 >> 0x20);
                  crop_pack4_sse((Mat *)&bottom_blob_shapes,(Mat *)&bottom_blobs_unpacked,_hoffset,
                                 _woffset);
                  piVar5 = (int *)CONCAT44(bottom_blobs_unpacked.
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                           bottom_blobs_unpacked.
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           ._M_impl.super__Vector_impl_data._M_finish._0_4_);
                  if (piVar5 != (int *)0x0) {
                    LOCK();
                    *piVar5 = *piVar5 + -1;
                    UNLOCK();
                    if (*piVar5 == 0) {
                      if (pAVar8 == (Allocator *)0x0) {
                        if (bottom_blobs_unpacked.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start != (pointer)0x0) {
                          free(bottom_blobs_unpacked.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_start);
                        }
                      }
                      else {
                        (*pAVar8->_vptr_Allocator[3])();
                      }
                    }
                  }
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                  piVar5 = (int *)CONCAT44(bottom_blob_shapes.
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                           bottom_blob_shapes.
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           ._M_impl.super__Vector_impl_data._M_finish._0_4_);
                  if (piVar5 != (int *)0x0) {
                    LOCK();
                    *piVar5 = *piVar5 + -1;
                    UNLOCK();
                    if (*piVar5 == 0) {
                      if (pAVar16 == (Allocator *)0x0) {
                        if (bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start != (pointer)0x0) {
                          free(bottom_blob_shapes.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_start);
                        }
                      }
                      else {
                        (*pAVar16->_vptr_Allocator[3])();
                      }
                    }
                  }
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                  lVar19 = lVar19 + 1;
                } while (lVar19 < _outd);
              }
              lVar24 = lVar24 + 1;
            } while (lVar24 < this_00->c);
            local_190 = 0;
            bottom_blobs = local_b8;
          }
        }
      }
      else {
        Mat::clone((Mat *)&bottom_blob_shapes,(__fn *)&m,local_c8->blob_allocator,(int)uVar18,
                   (void *)(long)m.w);
        if (this_00 != (Mat *)&bottom_blob_shapes) {
          piVar5 = (int *)CONCAT44(bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_finish._4_4_,
                                   bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_finish._0_4_);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + 1;
            UNLOCK();
          }
          piVar5 = this_00->refcount;
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              if (this_00->allocator == (Allocator *)0x0) {
                if (this_00->data != (void *)0x0) {
                  free(this_00->data);
                }
              }
              else {
                (*this_00->allocator->_vptr_Allocator[3])();
              }
            }
          }
          this_00->cstep = 0;
          this_00->data = (void *)0x0;
          this_00->refcount = (int *)0x0;
          *(undefined8 *)((long)&this_00->refcount + 4) = 0;
          *(undefined8 *)((long)&this_00->elemsize + 4) = 0;
          this_00->dims = 0;
          this_00->w = 0;
          this_00->h = 0;
          this_00->d = 0;
          this_00->c = 0;
          this_00->data =
               bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start;
          this_00->refcount =
               (int *)CONCAT44(bottom_blob_shapes.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_finish._4_4_,
                               bottom_blob_shapes.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_finish._0_4_);
          this_00->elemsize =
               CONCAT44(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                        bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
          this_00->elempack = iStack_110;
          this_00->allocator = local_108;
          this_00->dims = iStack_100;
          this_00->w = iStack_fc;
          this_00->h = local_f8;
          this_00->d = iStack_f4;
          this_00->c = iStack_f0;
          this_00->cstep = local_e8;
        }
        piVar5 = (int *)CONCAT44(bottom_blob_shapes.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_finish._4_4_,
                                 bottom_blob_shapes.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_finish._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (local_108 == (Allocator *)0x0) {
              if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                free(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_start);
              }
            }
            else {
              (*local_108->_vptr_Allocator[3])();
            }
          }
        }
        local_190 = -100;
        if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0))
        goto LAB_002846e4;
      }
      piVar5 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (m.allocator == (Allocator *)0x0) {
            if (m.data != (void *)0x0) {
              free(m.data);
            }
          }
          else {
            (*(m.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      m.cstep = 0;
      m.data = (void *)0x0;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = 0;
      m.elemsize._4_4_ = 0;
      m.elempack = 0;
      m.dims = 0;
      m.w = 0;
      m.h = 0;
      m.d = 0;
      m.c = 0;
      bVar13 = false;
    }
  }
  else {
    if (((_outc & 3U) != 0) || (_outc / iVar21 != local_b0)) goto LAB_0028447e;
    if (this_00 != pMVar4) {
      piVar5 = pMVar4->refcount;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + 1;
        UNLOCK();
      }
      piVar5 = this_00->refcount;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          pvVar6 = this_00->data;
          pAVar8 = this_00->allocator;
          if (pAVar8 == (Allocator *)0x0) {
            if (pvVar6 != (void *)0x0) {
              free(pvVar6);
            }
          }
          else {
            (*pAVar8->_vptr_Allocator[3])(pAVar8,pvVar6,(long)_outc % (long)iVar21 & 0xffffffff);
          }
        }
      }
      this_00->cstep = 0;
      this_00->data = (void *)0x0;
      this_00->refcount = (int *)0x0;
      *(undefined8 *)((long)&this_00->refcount + 4) = 0;
      *(undefined8 *)((long)&this_00->elemsize + 4) = 0;
      this_00->dims = 0;
      this_00->w = 0;
      this_00->h = 0;
      this_00->d = 0;
      this_00->c = 0;
      piVar5 = pMVar4->refcount;
      this_00->data = pMVar4->data;
      this_00->refcount = piVar5;
      this_00->elemsize = pMVar4->elemsize;
      this_00->elempack = pMVar4->elempack;
      this_00->allocator = pMVar4->allocator;
      iVar3 = pMVar4->w;
      iVar21 = pMVar4->h;
      iVar22 = pMVar4->d;
      this_00->dims = pMVar4->dims;
      this_00->w = iVar3;
      this_00->h = iVar21;
      this_00->d = iVar22;
      this_00->c = pMVar4->c;
      this_00->cstep = pMVar4->cstep;
    }
    bVar13 = false;
    local_190 = 0;
  }
  if (!bVar13) {
    return local_190;
  }
LAB_00284a0a:
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            (&bottom_blobs_unpacked,
             ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7,
             (allocator_type *)&m);
  pMVar17 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  bVar25 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_finish != pMVar17;
  if (bVar25) {
    lVar24 = 0;
    uVar23 = 0;
    do {
      m.data = *(void **)((long)&pMVar17->data + lVar24);
      piVar5 = *(int **)((long)&pMVar17->refcount + lVar24);
      m.refcount._0_4_ = SUB84(piVar5,0);
      m.refcount._4_4_ = (undefined4)((ulong)piVar5 >> 0x20);
      uVar11 = *(undefined8 *)((long)&pMVar17->elemsize + lVar24);
      m.elemsize._0_4_ = (undefined4)uVar11;
      m.elemsize._4_4_ = (undefined4)((ulong)uVar11 >> 0x20);
      m.elempack = *(int *)((long)&pMVar17->elempack + lVar24);
      m.allocator = *(Allocator **)((long)&pMVar17->allocator + lVar24);
      puVar2 = (undefined8 *)((long)&pMVar17->dims + lVar24);
      uVar11 = *puVar2;
      uVar12 = puVar2[1];
      m.dims = (int)uVar11;
      m.w = (int)((ulong)uVar11 >> 0x20);
      m.h = (int)uVar12;
      m.d = (int)((ulong)uVar12 >> 0x20);
      m.c = *(int *)((long)&pMVar17->c + lVar24);
      m.cstep = *(size_t *)((long)&pMVar17->cstep + lVar24);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + 1;
        UNLOCK();
      }
      if (local_ac == 1) {
LAB_00284b46:
        pMVar17 = bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pMVar4 = (Mat *)((long)&(bottom_blobs_unpacked.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_start)->data + lVar24);
        bVar26 = true;
        if (pMVar4 != &m) {
          piVar5 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + 1;
            UNLOCK();
          }
          piVar5 = *(int **)((long)&(bottom_blobs_unpacked.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->refcount + lVar24);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              pvVar6 = *(void **)((long)&(bottom_blobs_unpacked.
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                          _M_impl.super__Vector_impl_data._M_start)->data + lVar24);
              plVar7 = *(long **)((long)&(bottom_blobs_unpacked.
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                          _M_impl.super__Vector_impl_data._M_start)->allocator +
                                 lVar24);
              if (plVar7 == (long *)0x0) {
                if (pvVar6 != (void *)0x0) {
                  free(pvVar6);
                }
              }
              else {
                (**(code **)(*plVar7 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&pMVar17->cstep + lVar24) = 0;
          *(undefined8 *)((long)&pMVar4->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar4->elemsize + 4) = 0;
          pMVar4->data = (void *)0x0;
          pMVar4->refcount = (int *)0x0;
          puVar2 = (undefined8 *)((long)&pMVar17->dims + lVar24);
          *puVar2 = 0;
          puVar2[1] = 0;
          *(undefined4 *)((long)&pMVar17->c + lVar24) = 0;
          puVar2 = (undefined8 *)((long)&pMVar17->data + lVar24);
          *puVar2 = m.data;
          puVar2[1] = CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          *(ulong *)((long)&pMVar17->elemsize + lVar24) =
               CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
          *(int *)((long)&pMVar17->elempack + lVar24) = m.elempack;
          *(Allocator **)((long)&pMVar17->allocator + lVar24) = m.allocator;
          puVar2 = (undefined8 *)((long)&pMVar17->dims + lVar24);
          *puVar2 = CONCAT44(m.w,m.dims);
          puVar2[1] = CONCAT44(m.d,m.h);
          *(int *)((long)&pMVar17->c + lVar24) = m.c;
          *(size_t *)((long)&pMVar17->cstep + lVar24) = m.cstep;
        }
      }
      else {
        bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start = *(pointer *)local_c8;
        bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = SUB84(local_c8->workspace_allocator,0);
        bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ =
             (undefined4)((ulong)local_c8->workspace_allocator >> 0x20);
        bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = SUB84(local_c8->workspace_allocator,0);
        bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_finish._4_4_ =
             (undefined4)((ulong)local_c8->workspace_allocator >> 0x20);
        convert_packing((Mat *)((long)&((bottom_blobs->
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                        _M_impl.super__Vector_impl_data._M_start)->data + lVar24),&m
                        ,1,(Option *)&bottom_blob_shapes);
        if (m.data != (void *)0x0 && (long)m.c * m.cstep != 0) goto LAB_00284b46;
        local_190 = -100;
        bVar26 = false;
      }
      piVar5 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (m.allocator == (Allocator *)0x0) {
            if (m.data != (void *)0x0) {
              free(m.data);
            }
          }
          else {
            (*(m.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      m.cstep = 0;
      m.data = (void *)0x0;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = 0;
      m.elemsize._4_4_ = 0;
      m.elempack = 0;
      m.dims = 0;
      m.w = 0;
      m.h = 0;
      m.d = 0;
      m.c = 0;
      if (!bVar26) break;
      uVar23 = uVar23 + 1;
      pMVar17 = (local_b8->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar24 = lVar24 + 0x48;
      bVar25 = uVar23 < (ulong)(((long)(local_b8->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar17 >>
                                3) * -0x71c71c71c71c71c7);
      bottom_blobs = local_b8;
    } while (bVar25);
  }
  if (!bVar25) {
    local_190 = Crop::forward(local_a0,&bottom_blobs_unpacked,top_blobs,local_c8);
  }
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&bottom_blobs_unpacked);
  return local_190;
}

Assistant:

int Crop_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& reference_blob = bottom_blobs[1];

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    Mat& top_blob = top_blobs[0];

#if __SSE2__
    int _woffset, _hoffset, _doffset, _coffset;
    int _outw, _outh, _outd, _outc;
    if (!starts_expr.empty() && !ends_expr.empty())
    {
        std::vector<Mat> bottom_blob_shapes(bottom_blobs.size());
        for (size_t i = 0; i < bottom_blobs.size(); i++)
        {
            bottom_blob_shapes[i] = bottom_blobs[i].shape();
        }
        eval_crop_expr(bottom_blob_shapes, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }
    else if (woffset == -233)
    {
        resolve_crop_roi(bottom_blob.shape(), (const int*)reference_blob, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }
    else
    {
        resolve_crop_roi(bottom_blob.shape(), reference_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }

#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        if (dims == 1)
        {
            int out_elempack = _outw % 16 == 0 ? 16 : _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 16 == 0 ? 16 : _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        if (dims == 1)
        {
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack8_avx(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack8_avx(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int out_elempack = _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);

                    crop_pack4_sse(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);

                        crop_pack4_sse(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    std::vector<Mat> bottom_blobs_unpacked(bottom_blobs.size());
    for (size_t i = 0; i < bottom_blobs.size(); i++)
    {
        Mat bottom_blob_unpacked = bottom_blobs[i];
        if (elempack != 1)
        {
            Option opt_pack1 = opt;
            opt_pack1.blob_allocator = opt.workspace_allocator;

            convert_packing(bottom_blobs[i], bottom_blob_unpacked, 1, opt_pack1);
            if (bottom_blob_unpacked.empty())
                return -100;
        }

        bottom_blobs_unpacked[i] = bottom_blob_unpacked;
    }

    return Crop::forward(bottom_blobs_unpacked, top_blobs, opt);
}